

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_convert(void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,
                   ma_uint64 sampleCount,ma_dither_mode ditherMode)

{
  ma_dither_mode mVar1;
  
  if (formatOut == formatIn) {
    memcpy(pOut,pIn,*(uint *)(&DAT_00176420 + (ulong)formatOut * 4) * sampleCount);
    return;
  }
  switch(formatIn) {
  case ma_format_u8:
    mVar1 = (&switchD_0013b9dc::switchdataD_0017571c)[formatOut - ma_format_s16] + 0x17571c;
    switch(formatOut) {
    case ma_format_s16:
      ma_pcm_u8_to_s16(pOut,pIn,sampleCount,mVar1);
      return;
    case ma_format_s24:
      ma_pcm_u8_to_s24(pOut,pIn,sampleCount,mVar1);
      return;
    case ma_format_s32:
      ma_pcm_u8_to_s32(pOut,pIn,sampleCount,mVar1);
      return;
    case ma_format_f32:
      ma_pcm_u8_to_f32(pOut,pIn,sampleCount,mVar1);
      return;
    }
    break;
  case ma_format_s16:
    mVar1 = (&switchD_0013ba71::switchdataD_00175708)[formatOut - ma_format_u8] + 0x175708;
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s16_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      ma_pcm_s16_to_s24(pOut,pIn,sampleCount,mVar1);
      return;
    case ma_format_s32:
      ma_pcm_s16_to_s32(pOut,pIn,sampleCount,mVar1);
      return;
    case ma_format_f32:
      ma_pcm_s16_to_f32(pOut,pIn,sampleCount,mVar1);
      return;
    }
    break;
  case ma_format_s24:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s24_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s24_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s32:
      ma_pcm_s24_to_s32(pOut,pIn,sampleCount,
                        (&switchD_0013ba27::switchdataD_001756f4)[formatOut - ma_format_u8] +
                        0x1756f4);
      return;
    case ma_format_f32:
      ma_pcm_s24_to_f32(pOut,pIn,sampleCount,
                        (&switchD_0013ba27::switchdataD_001756f4)[formatOut - ma_format_u8] +
                        0x1756f4);
      return;
    }
    break;
  case ma_format_s32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_s32_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_s32_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      ma_pcm_s32_to_s24(pOut,pIn,sampleCount,
                        (&switchD_0013ba4c::switchdataD_001756e0)[formatOut - ma_format_u8] +
                        0x1756e0);
      return;
    case ma_format_f32:
      ma_pcm_s32_to_f32(pOut,pIn,sampleCount,
                        (&switchD_0013ba4c::switchdataD_001756e0)[formatOut - ma_format_u8] +
                        0x1756e0);
      return;
    }
    break;
  case ma_format_f32:
    switch(formatOut) {
    case ma_format_u8:
      ma_pcm_f32_to_u8(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s16:
      ma_pcm_f32_to_s16(pOut,pIn,sampleCount,ditherMode);
      return;
    case ma_format_s24:
      ma_pcm_f32_to_s24(pOut,pIn,sampleCount,
                        (&switchD_0013ba02::switchdataD_001756d0)[formatOut - ma_format_u8] +
                        0x1756d0);
      return;
    case ma_format_s32:
      ma_pcm_f32_to_s32(pOut,pIn,sampleCount,
                        (&switchD_0013ba02::switchdataD_001756d0)[formatOut - ma_format_u8] +
                        0x1756d0);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_pcm_convert(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 sampleCount, ma_dither_mode ditherMode)
{
    if (formatOut == formatIn) {
        ma_copy_memory_64(pOut, pIn, sampleCount * ma_get_bytes_per_sample(formatOut));
        return;
    }

    switch (formatIn)
    {
        case ma_format_u8:
        {
            switch (formatOut)
            {
                case ma_format_s16: ma_pcm_u8_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_u8_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_u8_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_u8_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s16:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s16_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s16_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s16_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s16_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s24:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s24_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s24_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_s24_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s24_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_s32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_s32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_s32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_s32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_f32: ma_pcm_s32_to_f32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        case ma_format_f32:
        {
            switch (formatOut)
            {
                case ma_format_u8:  ma_pcm_f32_to_u8( pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s16: ma_pcm_f32_to_s16(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s24: ma_pcm_f32_to_s24(pOut, pIn, sampleCount, ditherMode); return;
                case ma_format_s32: ma_pcm_f32_to_s32(pOut, pIn, sampleCount, ditherMode); return;
                default: break;
            }
        } break;

        default: break;
    }
}